

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void it_playing_reset_resamplers(IT_PLAYING *playing,int32 pos)

{
  undefined4 uVar1;
  int32 pos_00;
  undefined4 in_ESI;
  IT_PLAYING *in_RDI;
  int unaff_retaddr;
  int channels;
  int quality;
  int bits;
  int32 in_stack_ffffffffffffffe4;
  int src_channels;
  
  uVar1 = 8;
  if ((in_RDI->sample->flags & 2) != 0) {
    uVar1 = 0x10;
  }
  src_channels = in_RDI->resampling_quality;
  pos_00 = 1;
  if ((in_RDI->sample->flags & 4) != 0) {
    pos_00 = 2;
  }
  if ((-1 < in_RDI->sample->max_resampling_quality) &&
     (in_RDI->sample->max_resampling_quality < src_channels)) {
    src_channels = in_RDI->sample->max_resampling_quality;
  }
  dumb_reset_resampler_n
            (unaff_retaddr,(DUMB_RESAMPLER *)in_RDI,(void *)CONCAT44(in_ESI,uVar1),src_channels,
             pos_00,in_stack_ffffffffffffffe4,channels,bits);
  (in_RDI->resampler).pickup_data = in_RDI;
  in_RDI->time_lost = 0;
  in_RDI->flags = in_RDI->flags & 0xfffffff7;
  it_playing_update_resamplers(in_RDI);
  return;
}

Assistant:

static void it_playing_reset_resamplers(IT_PLAYING *playing, int32 pos)
{
	int bits = playing->sample->flags & IT_SAMPLE_16BIT ? 16 : 8;
	int quality = playing->resampling_quality;
	int channels = playing->sample->flags & IT_SAMPLE_STEREO ? 2 : 1;
	if (playing->sample->max_resampling_quality >= 0 && quality > playing->sample->max_resampling_quality)
		quality = playing->sample->max_resampling_quality;
	dumb_reset_resampler_n(bits, &playing->resampler, playing->sample->data, channels, pos, 0, 0, quality);
	playing->resampler.pickup_data = playing;
	playing->time_lost = 0;
	playing->flags &= ~IT_PLAYING_DEAD;
	it_playing_update_resamplers(playing);
}